

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O1

int dlep_session_update_extensions
              (dlep_session *session,uint8_t *extvalues,size_t extcount,_Bool radio)

{
  size_t *psVar1;
  ushort uVar2;
  int iVar3;
  ulong in_RAX;
  avl_tree *paVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (((&log_global_mask)[session->log_source] & 2) != 0) {
    oonf_log(2,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0xef,0,0,
             "Update session extension list");
  }
  if (3 < (session->parser).extension_count) {
    uVar7 = 3;
    do {
      if (extcount != 0) {
        sVar6 = 0;
        do {
          if ((session->parser).extensions[uVar7]->id ==
              (uint)(ushort)(*(ushort *)(extvalues + sVar6 * 2) << 8 |
                            *(ushort *)(extvalues + sVar6 * 2) >> 8)) goto LAB_0013e126;
          sVar6 = sVar6 + 1;
        } while (extcount != sVar6);
      }
      (*(&(session->parser).extensions[uVar7]->cb_session_deactivate_radio)[!radio])(session);
LAB_0013e126:
      uVar7 = uVar7 + 1;
    } while (uVar7 < (session->parser).extension_count);
  }
  (session->parser).extension_count = 3;
  if (extcount != 0) {
    sVar6 = 0;
    do {
      uVar2 = *(ushort *)(extvalues + sVar6 * 2) << 8 | *(ushort *)(extvalues + sVar6 * 2) >> 8;
      uStack_38 = (ulong)CONCAT24(uVar2,(undefined4)uStack_38);
      paVar4 = dlep_extension_get_tree();
      lVar5 = avl_find(paVar4,(long)&uStack_38 + 4);
      if (lVar5 != 0) {
        if (((&log_global_mask)[session->log_source] & 2) != 0) {
          oonf_log(2,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x10e,0,0,
                   "Add extension: %d",uVar2);
        }
        (session->parser).extensions[(session->parser).extension_count] =
             (dlep_extension *)(lVar5 + -0x90);
        psVar1 = &(session->parser).extension_count;
        *psVar1 = *psVar1 + 1;
      }
      sVar6 = sVar6 + 1;
    } while (extcount != sVar6);
  }
  iVar3 = _update_allowed_tlvs(session);
  return iVar3;
}

Assistant:

int
dlep_session_update_extensions(struct dlep_session *session, const uint8_t *extvalues, size_t extcount, bool radio) {
  struct dlep_extension *ext;
  size_t i, j;
  bool deactivate;
  uint16_t extid;
  OONF_INFO(session->log_source, "Update session extension list");

  /* deactivate all extensions not present anymore  */
  for (j = DLEP_EXTENSION_BASE_COUNT; j < session->parser.extension_count; j++) {
    deactivate = true;

    for (i = 0; i < extcount; i++) {
      memcpy(&extid, &extvalues[i * 2], sizeof(extid));
      if (ntohs(extid) == session->parser.extensions[j]->id) {
        deactivate = false;
        break;
      }
    }

    if (deactivate) {
      if (radio) {
        session->parser.extensions[j]->cb_session_deactivate_radio(session);
      }
      else {
        session->parser.extensions[j]->cb_session_deactivate_router(session);
      }
    }
  }

  /* generate new session extension list */
  session->parser.extension_count = DLEP_EXTENSION_BASE_COUNT;
  for (i = 0; i < extcount; i++) {
    memcpy(&extid, &extvalues[i * 2], sizeof(extid));

    ext = dlep_extension_get(ntohs(extid));
    if (ext) {
      OONF_INFO(session->log_source, "Add extension: %d", ntohs(extid));

      session->parser.extensions[session->parser.extension_count] = ext;
      session->parser.extension_count++;
    }
  }
  return _update_allowed_tlvs(session);
}